

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O2

void phmap::priv::(anonymous_namespace)::
     DoTest<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>,std::pair<long,long>>
               (char *param_1,
               unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               *b,vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *values)

{
  _Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
  *p_Var1;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long lVar3;
  size_type sVar4;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar5;
  size_type sVar6;
  reference ppVar7;
  EVP_PKEY_CTX *pEVar8;
  btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
  *siglen;
  node_type *pnVar9;
  unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  *lhs;
  AssertionResult *pAVar10;
  AssertionResult *siglen_00;
  size_t siglen_01;
  AssertionResult *siglen_02;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *p_Var11;
  uchar *sig;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  uchar *puVar12;
  uchar *extraout_RDX_02;
  uchar *extraout_RDX_03;
  uchar *sig_01;
  uchar *sig_02;
  uchar *sig_03;
  uchar *sig_04;
  size_t i_7;
  long lVar13;
  pointer *__ptr;
  char *pcVar14;
  AssertionResult *pAVar15;
  AssertionResult *pAVar16;
  size_t in_R9;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  this_00;
  size_t i;
  ulong uVar17;
  size_t i_6;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>
  b_00;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
  b_01;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
  b_02;
  const_iterator hint;
  iterator begin;
  iterator begin_00;
  iterator iVar18;
  const_iterator cVar19;
  const_iterator cVar20;
  iterator iVar21;
  iterator iVar22;
  pair<std::_Rb_tree_iterator<std::pair<const_long,_long>_>,_bool> pVar23;
  iterator iVar24;
  btree_iterator<const_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_const_std::pair<const_long,_long>_&,_const_std::pair<const_long,_long>_*>
  e;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
  e_00;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
  e_01;
  iterator end;
  iterator end_00;
  iterator end_01;
  iterator end_02;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_17;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  AssertionResult local_f8;
  unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  b_range;
  unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  b_copy;
  uchar *sig_00;
  
  pAVar10 = &gtest_ar_13;
  siglen_00 = &gtest_ar_13;
  siglen_02 = &gtest_ar_13;
  pAVar15 = &gtest_ar_13;
  lVar13 = 0;
  local_f8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )param_1;
  for (uVar17 = 0;
      uVar5._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           local_f8.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl,
      lVar3 = *(long *)&(b->
                        super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                        ).tree_.
                        super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                        .
                        super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                        .
                        super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                        .tree_.root_,
      uVar17 < (ulong)((long)(b->
                             super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                             ).tree_.
                             super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                             .
                             super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                             .
                             super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                             .tree_.rightmost_ - lVar3 >> 4); uVar17 = uVar17 + 1) {
    p_Var1 = (_Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
              *)(lVar3 + lVar13);
    b_range.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.root_.
    super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
           *)&p_Var1->
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    ;
    b_range.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.rightmost_ =
         p_Var1[1].
         super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
         .
         super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
         ._M_head_impl;
    anon_unknown_0::
    unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::insert((pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>,_bool>
              *)&b_copy,
             (unique_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)param_1,(value_type *)&b_range);
    p_Var1 = (_Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
              *)(*(long *)&(b->
                           super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                           ).tree_.
                           super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                           .
                           super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                           .
                           super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                           .tree_.root_ + lVar13);
    b_copy.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.root_.
    super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    .
    super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
    ._M_head_impl =
         *(_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
           *)&p_Var1->
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
    ;
    b_copy.
    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    .tree_.
    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .
    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
    .tree_.rightmost_ =
         p_Var1[1].
         super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
         .
         super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
         ._M_head_impl;
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::value_check((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                   *)param_1,(value_type *)&b_copy);
    lVar13 = lVar13 + 0x10;
  }
  b_range.
  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
  .tree_.
  super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .
  super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
  .tree_.root_.
  super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
  .
  super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
        )base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         ::size((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                 *)local_f8.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
  lhs = &b_range;
  lVar13 = (long)(b->
                 super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                 ).tree_.
                 super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                 .
                 super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                 .
                 super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                 .tree_.rightmost_ -
           *(long *)&(b->
                     super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                     ).tree_.
                     super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                     .
                     super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                     .
                     super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                     .tree_.root_;
  pAVar16 = &gtest_ar_2;
  gtest_ar_2.success_ = SUB81(lVar13 >> 4,0);
  gtest_ar_2._1_7_ = SUB87(lVar13 >> 0xc,0);
  pcVar14 = "mutable_b.size()";
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&b_copy,"mutable_b.size()","values.size()",(unsigned_long *)lhs,
             (unsigned_long *)pAVar16);
  if ((char)b_copy.
            super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
            .tree_.
            super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
            .
            super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
            .
            super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
            .tree_.root_.
            super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
            .
            super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
            .
            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
            .
            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
            ._M_head_impl == '\0') {
    testing::Message::Message((Message *)&b_range);
    if (b_copy.
        super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
        .tree_.
        super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
        .
        super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
        .tree_.rightmost_ == (node_type *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = *(char **)b_copy.
                          super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                          .tree_.
                          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .
                          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .
                          super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .tree_.rightmost_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x1b0,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&b_range);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    if (b_range.
        super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
        .tree_.
        super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
        .
        super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
        .
        super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
        .tree_.root_.
        super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
        .
        super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
        .
        super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
        .
        super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
         )0x0) {
      (**(code **)(*(long *)b_range.
                            super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                            .tree_.
                            super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                            .
                            super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                            .
                            super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                            .tree_.root_.
                            super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
                            .
                            super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
                            .
                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
                            .
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&b_copy.
                             super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                             .tree_.
                             super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                             .
                             super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                             .
                             super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                             .tree_ + 8));
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&b_copy.
                             super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                             .tree_.
                             super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                             .
                             super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                             .
                             super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                             .tree_ + 8));
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::verify((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)uVar5._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,(EVP_PKEY_CTX *)pcVar14,sig,(size_t)lhs,&pAVar16->success_,in_R9);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::base_checker(&b_copy.
                    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                   ,(base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                     *)uVar5._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
    sVar6 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
            ::size(&b_copy.
                    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  );
    gtest_ar_2.success_ = SUB81(sVar6,0);
    gtest_ar_2._1_7_ = SUB87(sVar6 >> 8,0);
    sVar6 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
            ::size((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                    *)uVar5._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
    gtest_ar_13._0_4_ = SUB84(sVar6,0);
    gtest_ar_13._4_4_ = SUB84(sVar6 >> 0x20,0);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&b_range,"b_copy.size()","const_b.size()",(unsigned_long *)&gtest_ar_2,
               (unsigned_long *)&gtest_ar_13);
    if ((char)b_range.
              super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              .tree_.
              super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
              .
              super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
              .tree_.root_.
              super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
              .
              super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
              .
              super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
              ._M_head_impl == '\0') {
      testing::Message::Message((Message *)&gtest_ar_2);
      if (b_range.
          super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
          .tree_.
          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
          .
          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
          .
          super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
          .tree_.rightmost_ == (node_type *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)b_range.
                            super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                            .tree_.
                            super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                            .
                            super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                            .
                            super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                            .tree_.rightmost_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1b6,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_13,(Message *)&gtest_ar_2);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13);
      if ((long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar_2._1_7_,gtest_ar_2.success_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&b_range.
                             super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                             .tree_.
                             super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                             .
                             super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                             .
                             super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                             .tree_ + 8));
    lVar13 = 0;
    for (uVar17 = 0;
        uVar5._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )local_f8.message_,
        lVar3 = *(long *)&(b->
                          super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                          ).tree_.
                          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .
                          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .
                          super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .tree_.root_,
        uVar17 < (ulong)((long)(b->
                               super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                               ).tree_.
                               super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .tree_.rightmost_ - lVar3 >> 4); uVar17 = uVar17 + 1) {
      iVar18 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               ::find(&b_copy.
                       super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                      ,(key_type *)(lVar3 + lVar13));
      b_range.
      super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
      .tree_.
      super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
      .
      super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
      .
      super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
      .tree_.root_.
      super__Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
      .
      super__Tuple_impl<1UL,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
      .
      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
      .
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_*>
            )iVar18.node;
      b_range.
      super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
      .tree_.
      super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
      .
      super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
      .
      super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
      .tree_.rightmost_ =
           (node_type *)
           CONCAT44(b_range.
                    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                    .tree_.
                    super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                    .
                    super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                    .
                    super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                    .tree_.rightmost_._4_4_,iVar18.position);
      ppVar7 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
               ::operator*((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                            *)&b_range);
      CheckPairEquals<long_const,long,long,long>
                (ppVar7,(pair<long,_long> *)
                        (*(long *)&(b->
                                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                                   ).tree_.
                                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .
                                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .
                                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .tree_.root_ + lVar13));
      lVar13 = lVar13 + 0x10;
    }
    cVar19 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::begin((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                      *)local_f8.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
    cVar20 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::end((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                    *)uVar5._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
    b_00._12_4_ = 0;
    b_00.node = (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                 *)SUB128(cVar19._0_12_,0);
    b_00.position = SUB124(cVar19._0_12_,8);
    e._12_4_ = 0;
    e.node = (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
              *)SUB128(cVar20._0_12_,0);
    e.position = SUB124(cVar20._0_12_,8);
    base_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
    ::
    base_checker<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>const,std::pair<long_const,long>const&,std::pair<long_const,long>const*>>
              ((base_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
                *)&b_range,b_00,e);
    sVar6 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
            ::size(&b_range.
                    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  );
    gtest_ar_13._0_4_ = SUB84(sVar6,0);
    gtest_ar_13._4_4_ = SUB84(sVar6 >> 0x20,0);
    gtest_ar_17._0_8_ =
         base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         ::size((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                 *)uVar5._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_2,"b_range.size()","const_b.size()",
               (unsigned_long *)&gtest_ar_13,(unsigned_long *)&gtest_ar_17);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_13);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar_2.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1bd,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_13);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    lVar13 = 0;
    for (uVar17 = 0;
        lVar3 = *(long *)&(b->
                          super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                          ).tree_.
                          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .
                          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .
                          super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .tree_.root_,
        uVar17 < (ulong)((long)(b->
                               super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                               ).tree_.
                               super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .tree_.rightmost_ - lVar3 >> 4); uVar17 = uVar17 + 1) {
      iVar18 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               ::find(&b_range.
                       super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                      ,(key_type *)(lVar3 + lVar13));
      gtest_ar_2.success_ = iVar18.node._0_1_;
      gtest_ar_2._1_7_ = iVar18.node._1_7_;
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = iVar18.position;
      ppVar7 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
               ::operator*((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                            *)&gtest_ar_2);
      CheckPairEquals<long_const,long,long,long>
                (ppVar7,(pair<long,_long> *)
                        (*(long *)&(b->
                                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                                   ).tree_.
                                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .
                                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .
                                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .tree_.root_ + lVar13));
      lVar13 = lVar13 + 0x10;
    }
    iVar21 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::begin((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                      *)&b_copy);
    pEVar8 = (EVP_PKEY_CTX *)iVar21.node;
    iVar22 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::end((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                    *)&b_copy);
    siglen = iVar22.node;
    b_01._12_4_ = 0;
    b_01.node = (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                 *)SUB128(iVar21._0_12_,0);
    b_01.position = SUB124(iVar21._0_12_,8);
    e_00._12_4_ = 0;
    e_00.node = (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                 *)SUB128(iVar22._0_12_,0);
    e_00.position = SUB124(iVar22._0_12_,8);
    puVar12 = (uchar *)(ulong)(uint)iVar22.position;
    unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
    ::
    insert<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>,std::pair<long_const,long>&,std::pair<long_const,long>*>>
              ((unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
                *)&b_range,b_01,e_00);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::verify(&b_range.
              super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
             ,pEVar8,sig_00,(size_t)siglen,puVar12,in_R9);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::clear(&b_range.
             super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
           );
    iVar21 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::begin((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                      *)&b_copy);
    iVar22 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::end((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                    *)&b_copy);
    b_02._12_4_ = 0;
    b_02.node = (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                 *)SUB128(iVar21._0_12_,0);
    b_02.position = SUB124(iVar21._0_12_,8);
    e_01._12_4_ = 0;
    e_01.node = (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                 *)SUB128(iVar22._0_12_,0);
    e_01.position = SUB124(iVar22._0_12_,8);
    unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
    ::
    insert<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>,256,false>>,std::pair<long_const,long>&,std::pair<long_const,long>*>>
              ((unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>
                *)&b_range,b_02,e_01);
    sVar6 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
            ::size(&b_range.
                    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  );
    gtest_ar_13._0_4_ = SUB84(sVar6,0);
    gtest_ar_13._4_4_ = SUB84(sVar6 >> 0x20,0);
    gtest_ar_17._0_8_ =
         base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         ::size(&b_copy.
                 super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               );
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_2,"b_range.size()","b_copy.size()",
               (unsigned_long *)&gtest_ar_13,(unsigned_long *)&gtest_ar_17);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_13);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar_2.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1c9,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_13);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    lVar13 = 0;
    for (uVar17 = 0;
        lVar3 = *(long *)&(b->
                          super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                          ).tree_.
                          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .
                          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .
                          super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .tree_.root_,
        uVar17 < (ulong)((long)(b->
                               super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                               ).tree_.
                               super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .tree_.rightmost_ - lVar3 >> 4); uVar17 = uVar17 + 1) {
      iVar18 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               ::find(&b_range.
                       super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                      ,(key_type *)(lVar3 + lVar13));
      gtest_ar_2.success_ = iVar18.node._0_1_;
      gtest_ar_2._1_7_ = iVar18.node._1_7_;
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = iVar18.position;
      ppVar7 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
               ::operator*((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                            *)&gtest_ar_2);
      CheckPairEquals<long_const,long,long,long>
                (ppVar7,(pair<long,_long> *)
                        (*(long *)&(b->
                                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                                   ).tree_.
                                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .
                                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .
                                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .tree_.root_ + lVar13));
      lVar13 = lVar13 + 0x10;
    }
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::operator=(&b_range.
                 super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                ,&b_range.
                  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               );
    uVar5._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         local_f8.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    sVar6 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
            ::size(&b_range.
                    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  );
    gtest_ar_13._0_4_ = SUB84(sVar6,0);
    gtest_ar_13._4_4_ = SUB84(sVar6 >> 0x20,0);
    gtest_ar_17._0_8_ =
         base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         ::size(&b_copy.
                 super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               );
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_2,"b_range.size()","b_copy.size()",
               (unsigned_long *)&gtest_ar_13,(unsigned_long *)&gtest_ar_17);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_13);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar_2.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1d0,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_13);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::clear(&b_range.
             super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
           );
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::operator=(&b_range.
                 super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                ,&b_copy.
                  super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               );
    sVar6 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
            ::size(&b_range.
                    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  );
    gtest_ar_13._0_4_ = SUB84(sVar6,0);
    gtest_ar_13._4_4_ = SUB84(sVar6 >> 0x20,0);
    gtest_ar_17._0_8_ =
         base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         ::size(&b_copy.
                 super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               );
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_2,"b_range.size()","b_copy.size()",
               (unsigned_long *)&gtest_ar_13,(unsigned_long *)&gtest_ar_17);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_13);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar_2.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1d5,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_13);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::clear(&b_range.
             super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
           );
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::swap(&b_range.
            super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
           ,&b_copy.
             super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
          );
    sVar6 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
            ::size(&b_copy.
                    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  );
    gtest_ar_13._0_4_ = SUB84(sVar6,0);
    gtest_ar_13._4_4_ = SUB84(sVar6 >> 0x20,0);
    gtest_ar_17._0_8_ = gtest_ar_17._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar_2,"b_copy.size()","0",(unsigned_long *)&gtest_ar_13,
               (int *)&gtest_ar_17);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_13);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar_2.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1da,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_13);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    sVar6 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
            ::size(&b_range.
                    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  );
    gtest_ar_13._0_4_ = SUB84(sVar6,0);
    gtest_ar_13._4_4_ = SUB84(sVar6 >> 0x20,0);
    gtest_ar_17._0_8_ =
         base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         ::size((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                 *)uVar5._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_2,"b_range.size()","const_b.size()",
               (unsigned_long *)&gtest_ar_13,(unsigned_long *)&gtest_ar_17);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_13);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar_2.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1db,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_13);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    lVar13 = 0;
    for (uVar17 = 0;
        lVar3 = *(long *)&(b->
                          super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                          ).tree_.
                          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .
                          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .
                          super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .tree_.root_,
        uVar17 < (ulong)((long)(b->
                               super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                               ).tree_.
                               super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .tree_.rightmost_ - lVar3 >> 4); uVar17 = uVar17 + 1) {
      iVar18 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               ::find(&b_range.
                       super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                      ,(key_type *)(lVar3 + lVar13));
      gtest_ar_2.success_ = iVar18.node._0_1_;
      gtest_ar_2._1_7_ = iVar18.node._1_7_;
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = iVar18.position;
      ppVar7 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
               ::operator*((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                            *)&gtest_ar_2);
      CheckPairEquals<long_const,long,long,long>
                (ppVar7,(pair<long,_long> *)
                        (*(long *)&(b->
                                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                                   ).tree_.
                                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .
                                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .
                                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .tree_.root_ + lVar13));
      lVar13 = lVar13 + 0x10;
    }
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::swap(&b_range.
            super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
           ,&b_copy.
             super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
          );
    uVar5._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         local_f8.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    std::
    swap<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>>
              (&b_range,&b_copy);
    sVar6 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
            ::size(&b_copy.
                    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  );
    gtest_ar_13._0_4_ = SUB84(sVar6,0);
    gtest_ar_13._4_4_ = SUB84(sVar6 >> 0x20,0);
    gtest_ar_17._0_8_ = gtest_ar_17._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar_2,"b_copy.size()","0",(unsigned_long *)&gtest_ar_13,
               (int *)&gtest_ar_17);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_13);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pcVar14 = "";
      }
      else {
        pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)gtest_ar_2.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1e3,pcVar14);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_13);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    sVar6 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
            ::size(&b_range.
                    super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                  );
    gtest_ar_13._0_4_ = SUB84(sVar6,0);
    gtest_ar_13._4_4_ = SUB84(sVar6 >> 0x20,0);
    gtest_ar_17._0_8_ =
         base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         ::size((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                 *)uVar5._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    pAVar16 = &gtest_ar_17;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_2,"b_range.size()","const_b.size()",
               (unsigned_long *)&gtest_ar_13,(unsigned_long *)pAVar16);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_13);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pAVar16 = (AssertionResult *)0x415b6f;
      }
      else {
        pAVar16 = *(AssertionResult **)
                   CONCAT44(gtest_ar_2.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_,
                            (int)gtest_ar_2.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
      }
      pAVar10 = (AssertionResult *)0x1e4;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1e4,&pAVar16->success_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_13);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    lVar13 = 0;
    for (uVar17 = 0;
        lVar3 = *(long *)&(b->
                          super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                          ).tree_.
                          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .
                          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .
                          super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .tree_.root_,
        uVar17 < (ulong)((long)(b->
                               super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                               ).tree_.
                               super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .tree_.rightmost_ - lVar3 >> 4); uVar17 = uVar17 + 1) {
      iVar18 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               ::find(&b_range.
                       super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                      ,(key_type *)(lVar3 + lVar13));
      gtest_ar_2.success_ = iVar18.node._0_1_;
      gtest_ar_2._1_7_ = iVar18.node._1_7_;
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = iVar18.position;
      ppVar7 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
               ::operator*((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                            *)&gtest_ar_2);
      CheckPairEquals<long_const,long,long,long>
                (ppVar7,(pair<long,_long> *)
                        (*(long *)&(b->
                                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                                   ).tree_.
                                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .
                                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .
                                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .tree_.root_ + lVar13));
      lVar13 = lVar13 + 0x10;
    }
    std::
    swap<phmap::priv::(anonymous_namespace)::unique_checker<phmap::btree_map<long,long,phmap::Less<long>,std::allocator<std::pair<long_const,long>>>,std::map<long,long,std::less<long>,std::allocator<std::pair<long_const,long>>>>>
              (&b_range,&b_copy);
    uVar5._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         local_f8.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    lVar13 = 0;
    puVar12 = extraout_RDX;
    for (uVar17 = 0;
        this_00._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )local_f8.message_,
        pEVar8 = *(EVP_PKEY_CTX **)
                  &(b->
                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                   ).tree_.
                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .
                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .tree_.root_,
        uVar17 < (ulong)((long)(b->
                               super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                               ).tree_.
                               super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .tree_.rightmost_ - (long)pEVar8 >> 4); uVar17 = uVar17 + 1) {
      base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
      ::erase((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               *)uVar5._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl,(key_type *)(pEVar8 + lVar13));
      gtest_ar_13._0_4_ =
           base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
           ::erase((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                    *)uVar5._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,
                   (key_type *)
                   (*(long *)&(b->
                              super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                              ).tree_.
                              super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                              .
                              super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                              .
                              super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                              .tree_.root_ + lVar13));
      gtest_ar_17._0_8_ = gtest_ar_17._0_8_ & 0xffffffff00000000;
      pAVar10 = &gtest_ar_13;
      pAVar16 = &gtest_ar_17;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_2,"mutable_b.erase(key_of_value(values[i]))","0",
                 (int *)&gtest_ar_13,(int *)&gtest_ar_17);
      if (gtest_ar_2.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_13);
        if ((undefined8 *)
            CONCAT44(gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,
                     (int)gtest_ar_2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl) == (undefined8 *)0x0) {
          pcVar14 = "";
        }
        else {
          pcVar14 = *(char **)CONCAT44(gtest_ar_2.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)gtest_ar_2.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_17,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x1ee,pcVar14);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_13);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
        if ((long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_2.message_);
        goto LAB_0013a28a;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_2.message_);
      lVar13 = lVar13 + 0x10;
      puVar12 = extraout_RDX_00;
    }
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::verify((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)local_f8.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,pEVar8,puVar12,(size_t)pAVar10,&pAVar16->success_,in_R9);
    sVar6 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
            ::size((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                    *)this_00._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
    gtest_ar_13._0_4_ = SUB84(sVar6,0);
    gtest_ar_13._4_4_ = SUB84(sVar6 >> 0x20,0);
    pAVar10 = &gtest_ar_17;
    gtest_ar_17._0_8_ = gtest_ar_17._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar_2,"const_b.size()","0",(unsigned_long *)&gtest_ar_13,
               (int *)pAVar10);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_13);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pAVar10 = (AssertionResult *)0x415b6f;
      }
      else {
        pAVar10 = *(AssertionResult **)
                   CONCAT44(gtest_ar_2.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_,
                            (int)gtest_ar_2.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
      }
      siglen_00 = (AssertionResult *)0x1f2;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1f2,&pAVar10->success_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_13);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::operator=((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                 *)this_00._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl,
                &b_copy.
                 super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               );
    lVar13 = 0;
    puVar12 = extraout_RDX_01;
    for (uVar17 = 0;
        pEVar8 = *(EVP_PKEY_CTX **)
                  &(b->
                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                   ).tree_.
                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .
                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .tree_.root_,
        uVar17 < (ulong)((long)(b->
                               super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                               ).tree_.
                               super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .tree_.rightmost_ - (long)pEVar8 >> 4); uVar17 = uVar17 + 1) {
      iVar18 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               ::find((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                       *)this_00._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,(key_type *)(pEVar8 + lVar13));
      iVar18 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               ::erase((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                        *)this_00._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl,iVar18);
      puVar12 = iVar18._8_8_;
      lVar13 = lVar13 + 0x10;
    }
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::verify((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)this_00._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,pEVar8,puVar12,(size_t)siglen_00,&pAVar10->success_,in_R9);
    sVar6 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
            ::size((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                    *)this_00._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
    gtest_ar_13._0_4_ = SUB84(sVar6,0);
    gtest_ar_13._4_4_ = SUB84(sVar6 >> 0x20,0);
    pAVar10 = &gtest_ar_17;
    gtest_ar_17._0_8_ = gtest_ar_17._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar_2,"const_b.size()","0",(unsigned_long *)&gtest_ar_13,
               (int *)pAVar10);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_13);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pAVar10 = (AssertionResult *)0x415b6f;
      }
      else {
        pAVar10 = *(AssertionResult **)
                   CONCAT44(gtest_ar_2.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_,
                            (int)gtest_ar_2.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x1fb,&pAVar10->success_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_13);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      if ((long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)this_00._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x20);
    lVar13 = 0;
    puVar12 = extraout_RDX_02;
    for (siglen_01 = 0;
        pEVar8 = *(EVP_PKEY_CTX **)
                  &(b->
                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                   ).tree_.
                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .
                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .tree_.root_,
        siglen_01 <
        (ulong)((long)(b->
                      super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                      ).tree_.
                      super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                      .
                      super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                      .
                      super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                      .tree_.rightmost_ - (long)pEVar8 >> 4); siglen_01 = siglen_01 + 1) {
      iVar18 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               ::upper_bound((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                              *)this_00._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl,(key_type *)(pEVar8 + lVar13));
      puVar2 = (undefined8 *)
               (*(long *)&(b->
                          super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                          ).tree_.
                          super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .
                          super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .
                          super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                          .tree_.root_ + lVar13);
      gtest_ar_17._0_8_ = *puVar2;
      gtest_ar_17.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           *(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             *)&((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(puVar2 + 1))->_M_t;
      sVar4 = (((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                 *)this_00._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl)->tree_).
              super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
              .
              super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
              .
              super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
              .tree_.size_;
      pVar23 = std::
               _Rb_tree<long,std::pair<long_const,long>,std::_Select1st<std::pair<long_const,long>>,std::less<long>,std::allocator<std::pair<long_const,long>>>
               ::_M_insert_unique<std::pair<long_const,long>const&>
                         ((_Rb_tree<long,std::pair<long_const,long>,std::_Select1st<std::pair<long_const,long>>,std::less<long>,std::allocator<std::pair<long_const,long>>>
                           *)this,(pair<const_long,_long> *)&gtest_ar_17);
      hint._12_4_ = 0;
      hint.node = (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                   *)SUB128(iVar18._0_12_,0);
      hint.position = SUB124(iVar18._0_12_,8);
      iVar24 = btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
               ::insert((btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                         *)local_f8.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl,hint,(value_type *)&gtest_ar_17);
      gtest_ar_2.success_ = iVar24.node._0_1_;
      gtest_ar_2._1_7_ = iVar24.node._1_7_;
      gtest_ar_2.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = iVar24.position;
      ppVar7 = btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
               ::operator*((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                            *)&gtest_ar_2);
      CheckPairEquals<long_const,long,long_const,long>
                (ppVar7,(pair<const_long,_long> *)(pVar23.first._M_node._M_node + 1));
      local_100._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)((long)local_f8.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl + 0x10))->_M_allocated_capacity;
      local_f8._0_8_ =
           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)local_f8.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl + 0x40))->_M_string_length;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar_13,"this->tree_.size()","this->checker_.size()",
                 (unsigned_long *)&local_100,(unsigned_long *)&local_f8);
      pAVar10 = &local_f8;
      if (gtest_ar_13.success_ == false) {
        testing::Message::Message((Message *)&local_100);
        pcVar14 = "";
        if ((undefined8 *)
            CONCAT44(gtest_ar_13.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,
                     (int)gtest_ar_13.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl) != (undefined8 *)0x0) {
          pcVar14 = *(char **)CONCAT44(gtest_ar_13.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (int)gtest_ar_13.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)pAVar10,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x16b,pcVar14);
        testing::internal::AssertHelper::operator=((AssertHelper *)pAVar10,(Message *)&local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pAVar10);
        if (local_100._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_100._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_13.message_);
      local_100._M_head_impl =
           *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
            ((long)local_f8.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl + 0x10);
      local_f8._0_8_ = sVar4 + (pVar23._8_4_ & 0xff);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&gtest_ar_13,"this->tree_.size()","size + checker_res.second",
                 (unsigned_long *)&local_100,(unsigned_long *)pAVar10);
      this_00._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )local_f8.message_;
      if (gtest_ar_13.success_ == false) {
        testing::Message::Message((Message *)&local_100);
        pAVar10 = (AssertionResult *)0x415b6f;
        if ((undefined8 *)
            CONCAT44(gtest_ar_13.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl._4_4_,
                     (int)gtest_ar_13.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl) != (undefined8 *)0x0) {
          pAVar10 = *(AssertionResult **)
                     CONCAT44(gtest_ar_13.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_,
                              (int)gtest_ar_13.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                   ,0x16c,&pAVar10->success_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)&local_100);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
        if (local_100._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_100._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_13.message_);
      lVar13 = lVar13 + 0x10;
      puVar12 = extraout_RDX_03;
    }
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::verify((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)this_00._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,pEVar8,puVar12,siglen_01,&pAVar10->success_,in_R9);
    iVar21 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::begin((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                      *)this_00._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
    iVar22 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::end((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                    *)this_00._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
    iVar18._12_4_ = 0;
    iVar18.node = (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                   *)SUB128(iVar21._0_12_,0);
    iVar18.position = SUB124(iVar21._0_12_,8);
    end._12_4_ = 0;
    end.node = (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                *)SUB128(iVar22._0_12_,0);
    end.position = SUB124(iVar22._0_12_,8);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::erase((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
             *)this_00._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,iVar18,end);
    sVar6 = base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
            ::size((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                    *)this_00._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
    gtest_ar_13._0_4_ = SUB84(sVar6,0);
    gtest_ar_13._4_4_ = SUB84(sVar6 >> 0x20,0);
    pAVar10 = &gtest_ar_17;
    gtest_ar_17._0_8_ = gtest_ar_17._0_8_ & 0xffffffff00000000;
    pcVar14 = "mutable_b.size()";
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar_2,"mutable_b.size()","0",(unsigned_long *)&gtest_ar_13,
               (int *)pAVar10);
    if (gtest_ar_2.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_13);
      if ((undefined8 *)
          CONCAT44(gtest_ar_2.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_2.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        pAVar10 = (AssertionResult *)0x415b6f;
      }
      else {
        pAVar10 = *(AssertionResult **)
                   CONCAT44(gtest_ar_2.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_,
                            (int)gtest_ar_2.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
      }
      siglen_02 = (AssertionResult *)0x206;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_17,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x206,&pAVar10->success_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_17,(Message *)&gtest_ar_13);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17);
      pcVar14 = &pAVar15->success_;
      if ((long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) + 8))();
        pcVar14 = &pAVar15->success_;
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_2.message_);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::verify((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)this_00._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,(EVP_PKEY_CTX *)pcVar14,sig_01,(size_t)siglen_02,&pAVar10->success_,
             in_R9);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::operator=((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                 *)this_00._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl,
                &b_copy.
                 super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               );
    iVar21 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::begin((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                      *)this_00._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
    gtest_ar_2.success_ = iVar21.node._0_1_;
    gtest_ar_2._1_7_ = iVar21.node._1_7_;
    gtest_ar_2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = iVar21.position;
    for (uVar17 = 0;
        uVar17 < (ulong)((long)(b->
                               super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                               ).tree_.
                               super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .tree_.rightmost_ -
                         *(long *)&(b->
                                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                                   ).tree_.
                                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .
                                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .
                                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .tree_.root_ >> 4) >> 1; uVar17 = uVar17 + 1) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
      ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                   *)&gtest_ar_2);
    }
    iVar21 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::begin((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                      *)this_00._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
    end_00.node._1_7_ = gtest_ar_2._1_7_;
    end_00.node._0_1_ = gtest_ar_2.success_;
    end_00.position =
         (int)gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    end_00._12_4_ = 0;
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::erase((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
             *)this_00._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,iVar21,end_00);
    gtest_ar_17._0_8_ =
         base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         ::size((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                 *)this_00._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    pAVar10 = &gtest_ar_17;
    uVar17 = (long)(b->
                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                   ).tree_.
                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .
                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .tree_.rightmost_ -
             *(long *)&(b->
                       super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                       ).tree_.
                       super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                       .
                       super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                       .
                       super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                       .tree_.root_ >> 4;
    local_100._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (uVar17 - (uVar17 >> 1));
    p_Var11 = &local_100;
    pcVar14 = "mutable_b.size()";
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_13,"mutable_b.size()","values.size() - values.size() / 2",
               (unsigned_long *)pAVar10,(unsigned_long *)p_Var11);
    if (gtest_ar_13.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_17);
      if ((undefined8 *)
          CONCAT44(gtest_ar_13.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl._4_4_,
                   (int)gtest_ar_13.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl) == (undefined8 *)0x0) {
        p_Var11 = (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   *)0x415b6f;
      }
      else {
        p_Var11 = *(_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    **)CONCAT44(gtest_ar_13.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_,
                                (int)gtest_ar_13.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl);
      }
      pAVar10 = (AssertionResult *)0x20e;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x20e,(char *)p_Var11);
      pcVar14 = &gtest_ar_17.success_;
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)pcVar14);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
      if (gtest_ar_17._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_17._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_13.message_);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::verify((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)this_00._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,(EVP_PKEY_CTX *)pcVar14,sig_02,(size_t)pAVar10,(uchar *)p_Var11,in_R9)
    ;
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::operator=((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                 *)this_00._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl,
                &b_copy.
                 super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               );
    iVar21 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::begin((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                      *)this_00._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
    gtest_ar_13._0_4_ = iVar21.node._0_4_;
    gtest_ar_13._4_4_ = iVar21.node._4_4_;
    gtest_ar_13.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = iVar21.position;
    for (uVar17 = 0;
        uVar17 < (ulong)((long)(b->
                               super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                               ).tree_.
                               super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .
                               super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                               .tree_.rightmost_ -
                         *(long *)&(b->
                                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                                   ).tree_.
                                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .
                                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .
                                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                                   .tree_.root_ >> 4) >> 1; uVar17 = uVar17 + 1) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
      ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                   *)&gtest_ar_13);
    }
    begin.node._4_4_ = gtest_ar_13._4_4_;
    begin.node._0_1_ = gtest_ar_13.success_;
    begin.node._1_3_ = gtest_ar_13._1_3_;
    begin.position =
         (int)gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    iVar21 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::end((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                    *)this_00._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
    begin._12_4_ = 0;
    end_01._12_4_ = 0;
    end_01.node = (btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                   *)SUB128(iVar21._0_12_,0);
    end_01.position = SUB124(iVar21._0_12_,8);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::erase((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
             *)this_00._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,begin,end_01);
    local_100._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         ::size((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                 *)this_00._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    p_Var11 = &local_100;
    local_f8._0_8_ =
         (ulong)((long)(b->
                       super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                       ).tree_.
                       super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                       .
                       super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                       .
                       super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                       .tree_.rightmost_ -
                 *(long *)&(b->
                           super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                           ).tree_.
                           super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                           .
                           super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                           .
                           super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                           .tree_.root_ >> 4) >> 1;
    pAVar10 = &local_f8;
    pcVar14 = "mutable_b.size()";
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_17,"mutable_b.size()","values.size() / 2",
               (unsigned_long *)p_Var11,(unsigned_long *)pAVar10);
    if (gtest_ar_17.success_ == false) {
      testing::Message::Message((Message *)&local_100);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_17.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pAVar10 = (AssertionResult *)0x415b6f;
      }
      else {
        pAVar10 = *(AssertionResult **)
                   gtest_ar_17.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      }
      p_Var11 = (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 *)0x216;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x216,&pAVar10->success_);
      pcVar14 = (char *)&local_100;
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)pcVar14);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_17.message_);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::verify((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)this_00._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,(EVP_PKEY_CTX *)pcVar14,sig_03,(size_t)p_Var11,&pAVar10->success_,
             in_R9);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::operator=((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                 *)this_00._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl,
                &b_copy.
                 super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               );
    iVar21 = btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
             ::begin((btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>
                      *)this_00._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
    gtest_ar_13._0_4_ = iVar21.node._0_4_;
    gtest_ar_13._4_4_ = iVar21.node._4_4_;
    gtest_ar_13.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = iVar21.position;
    uVar17 = 0;
    while( true ) {
      lVar13 = *(long *)&(b->
                         super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                         ).tree_.
                         super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                         .
                         super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                         .
                         super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                         .tree_.root_;
      pnVar9 = (b->
               super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               ).tree_.
               super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
               .
               super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
               .
               super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
               .tree_.rightmost_;
      if ((ulong)((long)pnVar9 - lVar13 >> 4) >> 2 <= uVar17) break;
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
      ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                   *)&gtest_ar_13);
      uVar17 = uVar17 + 1;
    }
    gtest_ar_2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         (int)gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    gtest_ar_2.success_ = gtest_ar_13.success_;
    gtest_ar_2._1_7_ = SUB87(CONCAT44(gtest_ar_13._4_4_,gtest_ar_13._0_4_) >> 8,0);
    for (uVar17 = 0; uVar17 < (ulong)((long)pnVar9 - lVar13 >> 4) >> 2; uVar17 = uVar17 + 1) {
      btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
      ::increment((btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>,_std::pair<const_long,_long>_&,_std::pair<const_long,_long>_*>
                   *)&gtest_ar_2);
      lVar13 = *(long *)&(b->
                         super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                         ).tree_.
                         super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                         .
                         super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                         .
                         super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                         .tree_.root_;
      pnVar9 = (b->
               super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
               ).tree_.
               super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
               .
               super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
               .
               super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
               .tree_.rightmost_;
    }
    begin_00.node._4_4_ = gtest_ar_13._4_4_;
    begin_00.node._0_1_ = gtest_ar_13.success_;
    begin_00.node._1_3_ = gtest_ar_13._1_3_;
    begin_00.position =
         (int)gtest_ar_13.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    end_02.node._1_7_ = gtest_ar_2._1_7_;
    end_02.node._0_1_ = gtest_ar_2.success_;
    end_02.position =
         (int)gtest_ar_2.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    begin_00._12_4_ = 0;
    end_02._12_4_ = 0;
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::erase((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
             *)this_00._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,begin_00,end_02);
    local_100._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
         ::size((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                 *)this_00._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
    p_Var11 = &local_100;
    uVar17 = (long)(b->
                   super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                   ).tree_.
                   super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .
                   super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .
                   super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                   .tree_.rightmost_ -
             *(long *)&(b->
                       super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                       ).tree_.
                       super_btree_map_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                       .
                       super_btree_set_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                       .
                       super_btree_container<phmap::priv::btree<phmap::priv::map_params<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>,_256,_false>_>_>
                       .tree_.root_ >> 4;
    local_f8._0_8_ = uVar17 - (uVar17 >> 2);
    pAVar10 = &local_f8;
    pcVar14 = "mutable_b.size()";
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_17,"mutable_b.size()","values.size() - values.size() / 4",
               (unsigned_long *)p_Var11,(unsigned_long *)pAVar10);
    if (gtest_ar_17.success_ == false) {
      testing::Message::Message((Message *)&local_100);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_17.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pAVar10 = (AssertionResult *)0x415b6f;
      }
      else {
        pAVar10 = *(AssertionResult **)
                   gtest_ar_17.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      }
      p_Var11 = (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 *)0x220;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
                 ,0x220,&pAVar10->success_);
      pcVar14 = (char *)&local_100;
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_f8,(Message *)pcVar14);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_f8);
      if (local_100._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_17.message_);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::verify((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
              *)this_00._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl,(EVP_PKEY_CTX *)pcVar14,sig_04,(size_t)p_Var11,&pAVar10->success_,
             in_R9);
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::clear((base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
             *)this_00._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
LAB_0013a28a:
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::~base_checker(&b_range.
                     super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                   );
    base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
    ::~base_checker(&b_copy.
                     super_base_checker<phmap::btree_map<long,_long,_phmap::Less<long>,_std::allocator<std::pair<const_long,_long>_>_>,_std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>_>
                   );
  }
  return;
}

Assistant:

void DoTest(const char *, T *b, const std::vector<V> &values) {
        typename KeyOfValue<typename T::key_type, V>::type key_of_value;

        T &mutable_b = *b;
        const T &const_b = *b;

        // Test insert.
        for (size_t i = 0; i < values.size(); ++i) {
            mutable_b.insert(values[i]);
            mutable_b.value_check(values[i]);
        }
        ASSERT_EQ(mutable_b.size(), values.size());

        const_b.verify();

        // Test copy constructor.
        T b_copy(const_b);
        EXPECT_EQ(b_copy.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_copy.find(key_of_value(values[i])), values[i]);
        }

        // Test range constructor.
        T b_range(const_b.begin(), const_b.end());
        EXPECT_EQ(b_range.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }

        // Test range insertion for values that already exist.
        b_range.insert(b_copy.begin(), b_copy.end());
        b_range.verify();

        // Test range insertion for new values.
        b_range.clear();
        b_range.insert(b_copy.begin(), b_copy.end());
        EXPECT_EQ(b_range.size(), b_copy.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }

        // Test assignment to self. Nothing should change.
        b_range.operator=(b_range);
        EXPECT_EQ(b_range.size(), b_copy.size());

        // Test assignment of new values.
        b_range.clear();
        b_range = b_copy;
        EXPECT_EQ(b_range.size(), b_copy.size());

        // Test swap.
        b_range.clear();
        b_range.swap(b_copy);
        EXPECT_EQ(b_copy.size(), 0);
        EXPECT_EQ(b_range.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }
        b_range.swap(b_copy);

        // Test non-member function swap.
        swap(b_range, b_copy);
        EXPECT_EQ(b_copy.size(), 0);
        EXPECT_EQ(b_range.size(), const_b.size());
        for (size_t i = 0; i < values.size(); ++i) {
            CheckPairEquals(*b_range.find(key_of_value(values[i])), values[i]);
        }
        swap(b_range, b_copy);

        // Test erase via values.
        for (size_t i = 0; i < values.size(); ++i) {
            mutable_b.erase(key_of_value(values[i]));
            // Erasing a non-existent key should have no effect.
            ASSERT_EQ(mutable_b.erase(key_of_value(values[i])), 0);
        }

        const_b.verify();
        EXPECT_EQ(const_b.size(), 0);

        // Test erase via iterators.
        mutable_b = b_copy;
        for (size_t i = 0; i < values.size(); ++i) {
            mutable_b.erase(mutable_b.find(key_of_value(values[i])));
        }

        const_b.verify();
        EXPECT_EQ(const_b.size(), 0);

        // Test insert with hint.
        for (size_t i = 0; i < values.size(); i++) {
            mutable_b.insert(mutable_b.upper_bound(key_of_value(values[i])), values[i]);
        }

        const_b.verify();

        // Test range erase.
        mutable_b.erase(mutable_b.begin(), mutable_b.end());
        EXPECT_EQ(mutable_b.size(), 0);
        const_b.verify();

        // First half.
        mutable_b = b_copy;
        typename T::iterator mutable_iter_end = mutable_b.begin();
        for (size_t i = 0; i < values.size() / 2; ++i) ++mutable_iter_end;
        mutable_b.erase(mutable_b.begin(), mutable_iter_end);
        EXPECT_EQ(mutable_b.size(), values.size() - values.size() / 2);
        const_b.verify();

        // Second half.
        mutable_b = b_copy;
        typename T::iterator mutable_iter_begin = mutable_b.begin();
        for (size_t i = 0; i < values.size() / 2; ++i) ++mutable_iter_begin;
        mutable_b.erase(mutable_iter_begin, mutable_b.end());
        EXPECT_EQ(mutable_b.size(), values.size() / 2);
        const_b.verify();

        // Second quarter.
        mutable_b = b_copy;
        mutable_iter_begin = mutable_b.begin();
        for (size_t i = 0; i < values.size() / 4; ++i) ++mutable_iter_begin;
        mutable_iter_end = mutable_iter_begin;
        for (size_t i = 0; i < values.size() / 4; ++i) ++mutable_iter_end;
        mutable_b.erase(mutable_iter_begin, mutable_iter_end);
        EXPECT_EQ(mutable_b.size(), values.size() - values.size() / 4);
        const_b.verify();

        mutable_b.clear();
    }